

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

bool __thiscall
dg::vr::RelationsAnalyzer::processICMP
          (RelationsAnalyzer *this,ValueRelations *oldGraph,ValueRelations *newGraph,
          VRAssumeBool *assume)

{
  ICmpInst *icmp;
  bool bVar1;
  bool bVar2;
  Relation rel;
  V op2;
  V op1;
  Value *local_40;
  Value *local_38;
  
  icmp = (ICmpInst *)(assume->super_VRAssume).val;
  local_38 = *(Value **)(icmp + -0x40);
  local_40 = *(Value **)(icmp + -0x20);
  rel = ICMPToRel(icmp,assume->assumption);
  bVar1 = ValueRelations::haveConflictingRelations<llvm::Value_const*,llvm::Value_const*>
                    (oldGraph,&local_38,rel,&local_40);
  if (!bVar1) {
    ValueRelations::set<llvm::Value_const*,llvm::Value_const*>(newGraph,&local_38,rel,&local_40);
    if (rel == EQ) {
      bVar2 = findEqualBorderBucket(this,oldGraph,local_38,local_40);
      if (!bVar2) {
        findEqualBorderBucket(this,oldGraph,local_40,local_38);
      }
    }
  }
  return !bVar1;
}

Assistant:

bool RelationsAnalyzer::processICMP(const ValueRelations &oldGraph,
                                    ValueRelations &newGraph,
                                    VRAssumeBool *assume) {
    const llvm::ICmpInst *icmp = llvm::cast<llvm::ICmpInst>(assume->getValue());
    bool assumption = assume->getAssumption();

    V op1 = icmp->getOperand(0);
    V op2 = icmp->getOperand(1);

    Relation rel = ICMPToRel(icmp, assumption);

    if (oldGraph.hasConflictingRelation(op1, op2, rel))
        return false;

    newGraph.set(op1, rel, op2);

    if (rel == Relations::EQ) {
        if (!findEqualBorderBucket(oldGraph, op1, op2))
            findEqualBorderBucket(oldGraph, op2, op1);
    }
    return true;
}